

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPController.cpp
# Opt level: O2

int __thiscall TCPController::close(TCPController *this,int __fd)

{
  iterator iVar1;
  __shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  int fd_local;
  shared_lock<std::shared_mutex> lock;
  mapped_type conn;
  
  lock._M_owns = true;
  fd_local = __fd;
  lock._M_pm = &this->mutex_;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  iVar1 = std::
          _Hashtable<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->connections)._M_h,&fd_local);
  if (iVar1.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_false>.
      _M_cur == (__node_type *)0x0) {
    iVar3 = -1;
  }
  else {
    p_Var2 = &std::__detail::
              _Map_base<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->connections,&fd_local)->
              super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&conn.super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>,p_Var2);
    iVar3 = (int)p_Var2;
    std::shared_lock<std::shared_mutex>::unlock(&lock);
    TCPConnection::close
              (conn.super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr,iVar3);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&conn.super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    iVar3 = 0;
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&lock);
  return iVar3;
}

Assistant:

int TCPController::close(int fd) {
    std::shared_lock lock(mutex_);
    if (connections.find(fd) != connections.end()) {
        auto conn = connections[fd];
        lock.unlock();
        conn->close();
        return 0;
    }
    return -1;
}